

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

size_t __thiscall
Darts::DoubleArrayImpl<void,void,int,void>::
commonPrefixSearch<Darts::DoubleArrayImpl<void,void,int,void>::result_pair_type>
          (DoubleArrayImpl<void,_void,_int,_void> *this,key_type *key,result_pair_type *results,
          size_t max_num_results,size_t length,size_t node_pos)

{
  bool bVar1;
  id_type iVar2;
  value_type_conflict1 vVar3;
  ulong in_RCX;
  result_pair_type *prVar4;
  long in_RDX;
  long in_RSI;
  DoubleArrayImpl<void,_void,_int,_void> *in_RDI;
  ulong in_R8;
  ulong in_R9;
  size_t i;
  unit_type unit;
  size_t num_results;
  ulong local_50;
  DoubleArrayUnit local_44;
  size_t local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  long local_20;
  long local_18;
  
  local_40 = 0;
  local_44.unit_ = in_RDI->array_[in_R9].unit_;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar2 = Details::DoubleArrayUnit::offset(&local_44);
  local_38 = iVar2 ^ local_38;
  if (local_30 == 0) {
    for (; *(char *)(local_18 + local_30) != '\0'; local_30 = local_30 + 1) {
      local_38 = *(byte *)(local_18 + local_30) ^ local_38;
      local_44.unit_ = in_RDI->array_[local_38].unit_;
      iVar2 = Details::DoubleArrayUnit::label(&local_44);
      if (iVar2 != *(byte *)(local_18 + local_30)) {
        return local_40;
      }
      iVar2 = Details::DoubleArrayUnit::offset(&local_44);
      local_38 = iVar2 ^ local_38;
      bVar1 = Details::DoubleArrayUnit::has_leaf(&local_44);
      if (bVar1) {
        if (local_40 < local_28) {
          prVar4 = (result_pair_type *)(local_20 + local_40 * 0x10);
          vVar3 = Details::DoubleArrayUnit::value(in_RDI->array_ + local_38);
          DoubleArrayImpl<void,_void,_int,_void>::set_result(in_RDI,prVar4,vVar3,local_30 + 1);
        }
        local_40 = local_40 + 1;
      }
    }
  }
  else {
    for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
      local_38 = *(byte *)(local_18 + local_50) ^ local_38;
      local_44.unit_ = in_RDI->array_[local_38].unit_;
      iVar2 = Details::DoubleArrayUnit::label(&local_44);
      if (iVar2 != *(byte *)(local_18 + local_50)) {
        return local_40;
      }
      iVar2 = Details::DoubleArrayUnit::offset(&local_44);
      local_38 = iVar2 ^ local_38;
      bVar1 = Details::DoubleArrayUnit::has_leaf(&local_44);
      if (bVar1) {
        if (local_40 < local_28) {
          prVar4 = (result_pair_type *)(local_20 + local_40 * 0x10);
          vVar3 = Details::DoubleArrayUnit::value(in_RDI->array_ + local_38);
          DoubleArrayImpl<void,_void,_int,_void>::set_result(in_RDI,prVar4,vVar3,local_50 + 1);
        }
        local_40 = local_40 + 1;
      }
    }
  }
  return local_40;
}

Assistant:

inline std::size_t DoubleArrayImpl<A, B, T, C>::commonPrefixSearch(
    const key_type *key, U *results, std::size_t max_num_results,
    std::size_t length, std::size_t node_pos) const {
  std::size_t num_results = 0;

  unit_type unit = array_[node_pos];
  node_pos ^= unit.offset();
  if (length != 0) {
    for (std::size_t i = 0; i < length; ++i) {
      node_pos ^= static_cast<uchar_type>(key[i]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[i])) {
        return num_results;
      }

      node_pos ^= unit.offset();
      if (unit.has_leaf()) {
        if (num_results < max_num_results) {
          set_result(&results[num_results], static_cast<value_type>(
              array_[node_pos].value()), i + 1);
        }
        ++num_results;
      }
    }
  } else {
    for ( ; key[length] != '\0'; ++length) {
      node_pos ^= static_cast<uchar_type>(key[length]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[length])) {
        return num_results;
      }

      node_pos ^= unit.offset();
      if (unit.has_leaf()) {
        if (num_results < max_num_results) {
          set_result(&results[num_results], static_cast<value_type>(
              array_[node_pos].value()), length + 1);
        }
        ++num_results;
      }
    }
  }

  return num_results;
}